

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[63],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [63],
               DebugComparison<unsigned_int,_unsigned_int_&> *params_1,uint *params_2,uint *params_3
               )

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  DebugComparison<unsigned_int,_unsigned_int_&> *params_00;
  uint *params_01;
  uint *params_02;
  long lVar1;
  String *in_stack_ffffffffffffff58;
  String argValues [4];
  
  str<char_const(&)[63]>
            (argValues,(kj *)params,(char (*) [63])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<unsigned_int,unsigned_int&>&>(argValues + 1,(kj *)params_1,params_00);
  str<unsigned_int&>(argValues + 2,(kj *)params_2,params_01);
  str<unsigned_int&>(argValues + 3,(kj *)params_3,params_02);
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,argValues_00);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}